

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O2

string * __thiscall
Json::GetParseJsonErrorStr_abi_cxx11_(string *__return_storage_ptr__,Json *this,int errorCode)

{
  char *pcVar1;
  allocator local_9;
  
  switch(errorCode) {
  case 1:
    pcVar1 = "The document is empty.";
    break;
  case 2:
    pcVar1 = "The document root must not follow by other values.";
    break;
  case 3:
    pcVar1 = "Invalid value.";
    break;
  case 4:
    pcVar1 = "Missing a name for object member.";
    break;
  case 5:
    pcVar1 = "Missing a colon after a name of object member.";
    break;
  case 6:
    pcVar1 = "Missing a comma or \'}\' after an object member.";
    break;
  case 7:
    pcVar1 = "Missing a comma or \']\' after an array element.";
    break;
  case 8:
    pcVar1 = "Incorrect hex digit after \\\\u escape in string.";
    break;
  case 9:
    pcVar1 = "The surrogate pair in string is invalid.";
    break;
  case 10:
    pcVar1 = "Invalid escape character in string.";
    break;
  case 0xb:
    pcVar1 = "Missing a closing quotation mark in string.";
    break;
  case 0xc:
    pcVar1 = "Invalid encoding in string.";
    break;
  case 0xd:
    pcVar1 = "Number too big to be stored in double.";
    break;
  case 0xe:
    pcVar1 = "Miss fraction part in number.";
    break;
  case 0xf:
    pcVar1 = "Miss exponent in number.";
    break;
  case 0x10:
    pcVar1 = "Parsing was terminated.";
    break;
  case 0x11:
    pcVar1 = "Unspecific syntax error.";
    break;
  default:
    pcVar1 = "Unknown";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string GetParseJsonErrorStr(int errorCode)
    {
        switch (errorCode)
        {
            case kParseErrorDocumentEmpty:
                return "The document is empty.";
            case kParseErrorDocumentRootNotSingular:
                return "The document root must not follow by other values.";
            case kParseErrorValueInvalid:
                return "Invalid value.";
            case kParseErrorObjectMissName:
                return "Missing a name for object member.";
            case kParseErrorObjectMissColon:
                return "Missing a colon after a name of object member.";
            case kParseErrorObjectMissCommaOrCurlyBracket:
                return "Missing a comma or '}' after an object member.";
            case kParseErrorArrayMissCommaOrSquareBracket:
                return "Missing a comma or ']' after an array element.";
            case kParseErrorStringUnicodeEscapeInvalidHex:
                return "Incorrect hex digit after \\\\u escape in string.";
            case kParseErrorStringUnicodeSurrogateInvalid:
                return "The surrogate pair in string is invalid.";
            case kParseErrorStringEscapeInvalid:
                return "Invalid escape character in string.";
            case kParseErrorStringMissQuotationMark:
                return "Missing a closing quotation mark in string.";
            case kParseErrorStringInvalidEncoding:
                return "Invalid encoding in string.";
            case kParseErrorNumberTooBig:
                return "Number too big to be stored in double.";
            case kParseErrorNumberMissFraction:
                return "Miss fraction part in number.";
            case kParseErrorNumberMissExponent:
                return "Miss exponent in number.";
            case kParseErrorTermination:
                return "Parsing was terminated.";
            case kParseErrorUnspecificSyntaxError:
                return "Unspecific syntax error.";
            default:
                return "Unknown";
        }
    }